

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altsvc.c
# Opt level: O3

altsvcinfo * Curl_altsvc_init(void)

{
  altsvcinfo *paVar1;
  
  paVar1 = (altsvcinfo *)(*Curl_ccalloc)(1,0x30);
  if (paVar1 != (altsvcinfo *)0x0) {
    Curl_llist_init(&paVar1->list,(Curl_llist_dtor)0x0);
    paVar1->flags = 8;
  }
  return paVar1;
}

Assistant:

struct altsvcinfo *Curl_altsvc_init(void)
{
  struct altsvcinfo *asi = calloc(1, sizeof(struct altsvcinfo));
  if(!asi)
    return NULL;
  Curl_llist_init(&asi->list, NULL);

  /* set default behavior */
  asi->flags = CURLALTSVC_H1
#ifdef USE_HTTP2
    | CURLALTSVC_H2
#endif
#ifdef USE_HTTP3
    | CURLALTSVC_H3
#endif
    ;
  return asi;
}